

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O2

void __thiscall Func::AddFrameDisplayCheck(Func *this,SymOpnd *fieldOpnd,uint32 slotId)

{
  uint value;
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar3;
  HashTable<FrameDisplayCheckRecord_*,_Memory::JitArenaAllocator> *pHVar4;
  PropertySym *pPVar5;
  FrameDisplayCheckRecord **ppFVar6;
  FrameDisplayCheckRecord *pFVar7;
  HashTable<unsigned_int,_Memory::JitArenaAllocator> *pHVar8;
  uint *puVar9;
  SlotArrayCheckTable *this_00;
  
  sourceContextId = GetSourceContextId(this);
  functionId = GetLocalFunctionId(this);
  bVar2 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01441eb0,ClosureRangeCheckPhase,sourceContextId,functionId);
  if (!bVar2) {
    if (this->parentFunc != (Func *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x411,"(IsTopFunc())","IsTopFunc()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    if (this->frameDisplayCheckTable == (FrameDisplayCheckTable *)0x0) {
      pHVar4 = HashTable<FrameDisplayCheckRecord_*,_Memory::JitArenaAllocator>::New(this->m_alloc,4)
      ;
      this->frameDisplayCheckTable = pHVar4;
    }
    pPVar5 = Sym::AsPropertySym(fieldOpnd->m_sym);
    ppFVar6 = HashTable<FrameDisplayCheckRecord_*,_Memory::JitArenaAllocator>::FindOrInsertNew
                        (this->frameDisplayCheckTable,(pPVar5->m_stackSym->super_Sym).m_id);
    pFVar7 = *ppFVar6;
    if (pFVar7 == (FrameDisplayCheckRecord *)0x0) {
      pFVar7 = (FrameDisplayCheckRecord *)
               new<Memory::JitArenaAllocator>(0x10,this->m_alloc,0x3d6ef4);
      pFVar7->table = (SlotArrayCheckTable *)0x0;
      pFVar7->slotId = 0xffffffff;
      *ppFVar6 = pFVar7;
    }
    value = pPVar5->m_propertyId;
    this_00 = pFVar7->table;
    if (this_00 == (SlotArrayCheckTable *)0x0) {
      pFVar7->slotId = value;
      if (slotId == 0xffffffff) {
        return;
      }
      pHVar8 = HashTable<unsigned_int,_Memory::JitArenaAllocator>::New(this->m_alloc,4);
      (*ppFVar6)->table = pHVar8;
      this_00 = (*ppFVar6)->table;
    }
    else {
      if (pFVar7->slotId < value) {
        pFVar7->slotId = value;
      }
      if (slotId == 0xffffffff) {
        return;
      }
    }
    puVar9 = HashTable<unsigned_int,_Memory::JitArenaAllocator>::FindOrInsert(this_00,slotId,value);
    if ((puVar9 != (uint *)0x0) && (*puVar9 < slotId)) {
      *puVar9 = slotId;
    }
  }
  return;
}

Assistant:

void Func::AddFrameDisplayCheck(IR::SymOpnd *fieldOpnd, uint32 slotId)
{
    if (PHASE_OFF(Js::ClosureRangeCheckPhase, this))
    {
        return;
    }

    Assert(IsTopFunc());
    if (this->frameDisplayCheckTable == nullptr)
    {
        this->frameDisplayCheckTable = FrameDisplayCheckTable::New(m_alloc, 4);
    }

    PropertySym *propertySym = fieldOpnd->m_sym->AsPropertySym();
    FrameDisplayCheckRecord **record = this->frameDisplayCheckTable->FindOrInsertNew(propertySym->m_stackSym->m_id);
    if (*record == nullptr)
    {
        *record = JitAnew(m_alloc, FrameDisplayCheckRecord);
    }

    uint32 frameDisplaySlot = propertySym->m_propertyId;
    if ((*record)->table == nullptr || (*record)->slotId < frameDisplaySlot)
    {
        (*record)->slotId = frameDisplaySlot;
    }

    if (slotId != (uint32)-1)
    {
        if ((*record)->table == nullptr)
        {
            (*record)->table = SlotArrayCheckTable::New(m_alloc, 4);
        }
        uint32 *pSlotId = (*record)->table->FindOrInsert(slotId, frameDisplaySlot);
        if (pSlotId && *pSlotId < slotId)
        {
            *pSlotId = slotId;
        }
    }
}